

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

void stbtt__dict_get_ints(stbtt__buf *b,int key,int outcount,stbtt_uint32 *out)

{
  bool bVar1;
  stbtt_uint32 sVar2;
  undefined1 local_38 [8];
  stbtt__buf operands;
  int i;
  stbtt_uint32 *out_local;
  int outcount_local;
  int key_local;
  stbtt__buf *b_local;
  
  _local_38 = stbtt__dict_get(b,key);
  operands.size = 0;
  while( true ) {
    bVar1 = false;
    if (operands.size < outcount) {
      bVar1 = (int)operands.data < operands.data._4_4_;
    }
    if (!bVar1) break;
    sVar2 = stbtt__cff_int((stbtt__buf *)local_38);
    out[operands.size] = sVar2;
    operands.size = operands.size + 1;
  }
  return;
}

Assistant:

static void stbtt__dict_get_ints(stbtt__buf *b, int key, int outcount, stbtt_uint32 *out)
{
   int i;
   stbtt__buf operands = stbtt__dict_get(b, key);
   for (i = 0; i < outcount && operands.cursor < operands.size; i++)
      out[i] = stbtt__cff_int(&operands);
}